

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::StartTesting(XmlReporter *this)

{
  byte bVar1;
  IConfig *pIVar2;
  string *attribute;
  long in_RDI;
  ReporterConfig *in_stack_fffffffffffffeb8;
  XmlWriter *in_stack_fffffffffffffec0;
  allocator *name;
  undefined7 in_stack_fffffffffffffed0;
  Ptr<Catch::IConfig> local_100;
  string local_f8 [16];
  XmlWriter *in_stack_ffffffffffffff18;
  XmlWriter *in_stack_ffffffffffffff20;
  allocator local_d1;
  string local_d0 [32];
  Ptr<Catch::IConfig> local_b0;
  string local_a8 [39];
  allocator local_81;
  string local_80 [128];
  
  ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
  XmlWriter::XmlWriter(in_stack_fffffffffffffec0,(ostream *)in_stack_fffffffffffffeb8);
  XmlWriter::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  XmlWriter::~XmlWriter(in_stack_fffffffffffffec0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Catch",&local_81);
  XmlWriter::startElement(in_stack_fffffffffffffec0,(string *)in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  ReporterConfig::fullConfig(in_stack_fffffffffffffeb8);
  pIVar2 = Ptr<Catch::IConfig>::operator->(&local_b0);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_a8);
  bVar1 = std::__cxx11::string::empty();
  bVar1 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_a8);
  Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)in_stack_fffffffffffffec0);
  if ((bVar1 & 1) != 0) {
    attribute = (string *)(in_RDI + 0x28);
    name = &local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"name",name);
    ReporterConfig::fullConfig(in_stack_fffffffffffffeb8);
    pIVar2 = Ptr<Catch::IConfig>::operator->(&local_100);
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_f8);
    XmlWriter::writeAttribute
              ((XmlWriter *)CONCAT17(bVar1,in_stack_fffffffffffffed0),(string *)name,attribute);
    std::__cxx11::string::~string(local_f8);
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)attribute);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  return;
}

Assistant:

virtual void StartTesting() {
            m_xml = XmlWriter( m_config.stream() );
            m_xml.startElement( "Catch" );
            if( !m_config.fullConfig()->name().empty() )
                m_xml.writeAttribute( "name", m_config.fullConfig()->name() );
        }